

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_event_trigger.c
# Opt level: O0

event_ctx * event_ctx_create(event_packet *ea,event_trigger trigger,void *parent)

{
  event_ctx_impl *ctx;
  void *parent_local;
  event_trigger trigger_local;
  event_packet *ea_local;
  
  ea_local = (event_packet *)malloc(0x98);
  if (ea_local == (event_packet *)0x0) {
    _mpp_log_l(2,0,"allocate event ctx failed\n");
    ea_local = (event_packet *)0x0;
  }
  else {
    if (0x80 < ea->cnt) {
      __assert_fail("ea->cnt <= 128",
                    "/workspace/llm4binary/github/license_c_cmakelists/HermanChen[P]mpp/test/mpp_event_trigger.c"
                    ,0xd0,
                    "struct event_ctx *event_ctx_create(struct event_packet *, event_trigger, void *)"
                   );
    }
    ea_local->e[8].idx = 0;
    ea_local->e[7].event = ea;
    *(code **)ea_local = event_notify;
    *(event_trigger *)ea_local->e = trigger;
    ea_local->e[8].event = parent;
    ea_local->e[7].idx = 1;
    pthread_create((pthread_t *)&ea_local->e[6].event,(pthread_attr_t *)0x0,event_trigger_thread,
                   ea_local);
  }
  return (event_ctx *)ea_local;
}

Assistant:

struct event_ctx* event_ctx_create(struct event_packet *ea,
                                   event_trigger trigger, void *parent)
{
    struct event_ctx_impl *ctx = (struct event_ctx_impl *)malloc(sizeof(*ctx));

    if (ctx == NULL) {
        mpp_err("allocate event ctx failed\n");
        return NULL;
    }

    assert(ea->cnt <= 128);

    ctx->event_idx = 0;
    ctx->ea = ea;

    ctx->notify = event_notify;
    ctx->trigger = trigger;
    ctx->parent = parent;

    ctx->flag = 1;
    pthread_create(&ctx->thr, NULL, event_trigger_thread, ctx);

    return (struct event_ctx *)ctx;
}